

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O1

EventObject * chatra::derefAsEventObject(Reference ref)

{
  Class *pCVar1;
  Class *pCVar2;
  EventObject *pEVar3;
  undefined8 *puVar4;
  
  if (((ref.node)->type == Object) && ((ref.node)->object != (Object *)0x0)) {
    pCVar1 = (Class *)(ref.node)->object[1]._vptr_Object;
    pCVar2 = Async::getClassStatic();
    if (pCVar1 == pCVar2) {
      pEVar3 = (EventObject *)&(ref.node)->object[1].super_Lockable;
    }
    else {
      pEVar3 = (EventObject *)0x0;
    }
    if (pEVar3 != (EventObject *)0x0) {
      return pEVar3;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = &PTR__exception_002468f0;
  *(undefined4 *)(puVar4 + 1) = 0x8c;
  __cxa_throw(puVar4,&RuntimeException::typeinfo,std::exception::~exception);
}

Assistant:

EventObject* derefAsEventObject(Reference ref) {
	if (ref.valueType() != ReferenceValueType::Object || ref.isNull())
		throw RuntimeException(StringId::IllegalArgumentException);

	auto* cl = ref.deref<ObjectBase>().getClass();
	EventObject* ret = nullptr;
	if (cl == Async::getClassStatic())
		ret = &ref.deref<Async>();

	if (ret != nullptr)
		return ret;

	throw RuntimeException(StringId::IllegalArgumentException);
}